

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  BBox1f BVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  BufferView<embree::Vec3fa> *pBVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  float fVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  size_t itime;
  ulong uVar27;
  long lVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [32];
  float fVar73;
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar89;
  undefined1 auVar85 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  Vec3fa n0;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  Vec3ff v3;
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  Vec3fa n1;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar108 [64];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  size_t local_1b0;
  size_t local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  ulong local_100;
  anon_class_16_2_07cfa4d6 local_f8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  undefined1 local_d8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar32._8_8_ = 0;
  auVar32._0_4_ =
       (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar32._4_4_ =
       (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar39._8_8_ = 0;
  auVar39._0_4_ = time_range->lower;
  auVar39._4_4_ = time_range->upper;
  uVar27 = vcmpps_avx512vl(auVar32,auVar39,1);
  auVar31 = vinsertps_avx(auVar39,auVar32,0x50);
  auVar32 = vinsertps_avx(auVar32,auVar39,0x50);
  bVar7 = (bool)((byte)uVar27 & 1);
  auVar30._0_4_ = (float)((uint)bVar7 * auVar31._0_4_ | (uint)!bVar7 * auVar32._0_4_);
  bVar7 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar30._4_4_ = (uint)bVar7 * auVar31._4_4_ | (uint)!bVar7 * auVar32._4_4_;
  bVar7 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar30._8_4_ = (uint)bVar7 * auVar31._8_4_ | (uint)!bVar7 * auVar32._8_4_;
  bVar7 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar30._12_4_ = (uint)bVar7 * auVar31._12_4_ | (uint)!bVar7 * auVar32._12_4_;
  auVar31 = vmovshdup_avx(auVar30);
  fVar75 = auVar31._0_4_;
  if (auVar30._0_4_ <= fVar75) {
    local_168 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 lower.field_0.m128;
    local_178 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 upper.field_0.m128;
    local_188 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 lower.field_0.m128;
    uVar27 = r->_begin;
    local_198 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 upper.field_0.m128;
    local_1b0 = __return_storage_ptr__->end;
    if (uVar27 < r->_end) {
      auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar31 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
      auVar108 = ZEXT1664(auVar31);
      auVar105 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      auVar31 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
      auVar106 = ZEXT1664(auVar31);
      auVar31 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
      auVar107 = ZEXT1664(auVar31);
      local_1a8 = k;
      do {
        BVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        auVar31._8_8_ = 0;
        auVar31._0_4_ = BVar1.lower;
        auVar31._4_4_ = BVar1.upper;
        auVar31 = vmovshdup_avx(auVar31);
        fVar60 = BVar1.lower;
        fVar10 = auVar31._0_4_ - fVar60;
        auVar40._0_4_ = (auVar30._0_4_ - fVar60) / fVar10;
        auVar40._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar38._0_4_ = (fVar75 - fVar60) / fVar10;
        auVar38._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar31 = vmulss_avx512f(auVar40,SUB6416(ZEXT464(0x3f800002),0));
        auVar32 = vmulss_avx512f(auVar38,SUB6416(ZEXT464(0x3f7ffffc),0));
        uVar2 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                    super_CurveGeometry.super_Geometry.field_0x58 +
                         *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                   super_CurveGeometry.field_0x68 * uVar27);
        uVar13 = (ulong)uVar2;
        uVar14 = (ulong)(uVar2 + 3);
        pBVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 vertices.items;
        if (uVar14 < (pBVar3->super_RawBufferView).num) {
          fVar10 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.super_Geometry.fnumTimeSegments;
          auVar31 = ZEXT416((uint)(fVar10 * auVar31._0_4_));
          auVar31 = vroundss_avx(auVar31,auVar31,9);
          auVar31 = vmaxss_avx(auVar76._0_16_,auVar31);
          uVar18 = (uint)auVar31._0_4_;
          auVar31 = ZEXT416((uint)(fVar10 * auVar32._0_4_));
          auVar31 = vroundss_avx(auVar31,auVar31,10);
          auVar31 = vminss_avx(auVar31,ZEXT416((uint)fVar10));
          uVar20 = (uint)auVar31._0_4_;
          bVar7 = uVar20 < uVar18;
          if (uVar18 <= uVar20) {
            uVar19 = (ulong)(int)uVar18;
            uVar21 = (ulong)(int)uVar20;
            uVar23 = (ulong)(uVar2 + 1);
            uVar24 = (ulong)(uVar2 + 2);
            pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                     super_CurveGeometry.normals.items;
            fVar60 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                     super_CurveGeometry.maxRadiusScale;
            lVar26 = uVar19 * 0x38 + 0x10;
            bVar29 = lVar26 == 0;
            auVar44 = bezier_basis0._3944_32_;
            do {
              lVar5 = *(long *)((long)pBVar3 + lVar26 + -0x10);
              lVar6 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar26);
              lVar17 = lVar6 * uVar13;
              auVar32 = auVar105._0_16_;
              auVar31 = vandps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar17)),auVar32);
              vucomiss_avx512f(auVar31);
              if (SEXT816(lVar17) != SEXT816(lVar6) * SEXT816((long)uVar13) || bVar29) {
LAB_01faa16f:
                if (!bVar7) {
                  auVar76 = ZEXT864(0) << 0x20;
                  goto LAB_01faa670;
                }
                break;
              }
              lVar22 = lVar6 * uVar23;
              auVar31 = vandps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar22)),auVar32);
              vucomiss_avx512f(auVar31);
              if (SEXT816(lVar22) != SEXT816(lVar6) * SEXT816((long)uVar23) || bVar29)
              goto LAB_01faa16f;
              lVar28 = lVar6 * uVar24;
              auVar31 = vandps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar28)),auVar32);
              vucomiss_avx512f(auVar31);
              if (SEXT816(lVar28) != SEXT816(lVar6) * SEXT816((long)uVar24) || bVar29)
              goto LAB_01faa16f;
              lVar25 = lVar6 * uVar14;
              auVar31 = vandps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar25)),auVar32);
              vucomiss_avx512f(auVar31);
              if (SEXT816(lVar25) != SEXT816(lVar6) * SEXT816((long)uVar14) || bVar29)
              goto LAB_01faa16f;
              auVar31 = *(undefined1 (*) [16])(lVar5 + lVar17);
              auVar32 = auVar106._0_16_;
              uVar11 = vcmpps_avx512vl(auVar31,auVar32,6);
              auVar39 = auVar107._0_16_;
              uVar12 = vcmpps_avx512vl(auVar31,auVar39,1);
              if ((~((ushort)uVar11 & (ushort)uVar12) & 7) != 0) goto LAB_01faa16f;
              auVar38 = *(undefined1 (*) [16])(lVar5 + lVar22);
              uVar11 = vcmpps_avx512vl(auVar38,auVar32,6);
              uVar12 = vcmpps_avx512vl(auVar38,auVar39,1);
              if ((~((ushort)uVar11 & (ushort)uVar12) & 7) != 0) goto LAB_01faa16f;
              auVar40 = *(undefined1 (*) [16])(lVar5 + lVar28);
              uVar11 = vcmpps_avx512vl(auVar40,auVar32,6);
              uVar12 = vcmpps_avx512vl(auVar40,auVar39,1);
              if ((~((ushort)uVar11 & (ushort)uVar12) & 7) != 0) goto LAB_01faa16f;
              auVar33 = *(undefined1 (*) [16])(lVar5 + lVar25);
              uVar11 = vcmpps_avx512vl(auVar33,auVar32,6);
              uVar12 = vcmpps_avx512vl(auVar33,auVar39,1);
              if ((~((ushort)uVar11 & (ushort)uVar12) & 7) != 0) goto LAB_01faa16f;
              lVar5 = *(long *)((long)pBVar4 + lVar26 + -0x10);
              lVar6 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar26);
              auVar41 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar13);
              uVar11 = vcmpps_avx512vl(auVar41,auVar32,6);
              uVar12 = vcmpps_avx512vl(auVar41,auVar39,1);
              if ((~((ushort)uVar11 & (ushort)uVar12) & 7) != 0) goto LAB_01faa16f;
              auVar42 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar23);
              uVar11 = vcmpps_avx512vl(auVar42,auVar32,6);
              uVar12 = vcmpps_avx512vl(auVar42,auVar39,1);
              if ((~((ushort)uVar11 & (ushort)uVar12) & 7) != 0) goto LAB_01faa16f;
              auVar32 = vshufps_avx(auVar31,auVar31,0xff);
              auVar39 = vinsertps_avx(auVar31,ZEXT416((uint)(auVar32._0_4_ * fVar60)),0x30);
              auVar31 = vshufps_avx(auVar38,auVar38,0xff);
              auVar81 = vinsertps_avx512f(auVar38,ZEXT416((uint)(auVar31._0_4_ * fVar60)),0x30);
              auVar31 = vshufps_avx(auVar40,auVar40,0xff);
              auVar40 = vinsertps_avx512f(auVar40,ZEXT416((uint)(auVar31._0_4_ * fVar60)),0x30);
              auVar31 = vshufps_avx(auVar33,auVar33,0xff);
              auVar38 = vinsertps_avx(auVar33,ZEXT416((uint)(auVar31._0_4_ * fVar60)),0x30);
              auVar31 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar24);
              auVar43._16_16_ = auVar44._16_16_;
              auVar32 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar14);
              auVar64._8_4_ = 0x80000000;
              auVar64._0_8_ = 0x8000000080000000;
              auVar64._12_4_ = 0x80000000;
              auVar99._0_4_ = auVar38._0_4_ * -0.0;
              auVar99._4_4_ = auVar38._4_4_ * -0.0;
              auVar99._8_4_ = auVar38._8_4_ * -0.0;
              auVar99._12_4_ = auVar38._12_4_ * -0.0;
              auVar33 = vfmadd213ps_avx512vl(ZEXT816(0),auVar40,auVar99);
              auVar33 = vaddps_avx512vl(auVar81,auVar33);
              auVar33 = vfmadd231ps_fma(auVar33,auVar39,auVar64);
              auVar34 = vmulps_avx512vl(auVar38,auVar108._0_16_);
              auVar69._8_4_ = 0x3f000000;
              auVar69._0_8_ = 0x3f0000003f000000;
              auVar69._12_4_ = 0x3f000000;
              auVar34 = vfmadd231ps_avx512vl(auVar34,auVar40,auVar69);
              auVar34 = vfmadd231ps_avx512vl(auVar34,auVar81,auVar108._0_16_);
              auVar90 = vfnmadd231ps_fma(auVar34,auVar39,auVar69);
              auVar35 = vmulps_avx512vl(auVar32,auVar64);
              auVar34 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
              auVar34 = vfmadd213ps_avx512vl(auVar34,auVar31,auVar35);
              auVar34 = vaddps_avx512vl(auVar42,auVar34);
              auVar36 = vfmadd231ps_avx512vl(auVar34,auVar41,auVar64);
              auVar61._0_12_ = ZEXT812(0);
              auVar61._12_4_ = 0;
              auVar34 = vmulps_avx512vl(auVar32,auVar61);
              auVar34 = vfmadd231ps_avx512vl(auVar34,auVar31,auVar69);
              auVar34 = vfmadd231ps_avx512vl(auVar34,auVar42,auVar61);
              auVar37 = vfnmadd231ps_avx512vl(auVar34,auVar41,auVar69);
              auVar34 = vaddps_avx512vl(auVar40,auVar99);
              auVar34 = vfmadd231ps_avx512vl(auVar34,auVar81,auVar61);
              auVar34 = vfmadd231ps_fma(auVar34,auVar39,auVar64);
              auVar100._0_4_ = auVar38._0_4_ * 0.5;
              auVar100._4_4_ = auVar38._4_4_ * 0.5;
              auVar100._8_4_ = auVar38._8_4_ * 0.5;
              auVar100._12_4_ = auVar38._12_4_ * 0.5;
              auVar38 = vfmadd231ps_avx512vl(auVar100,auVar61,auVar40);
              auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar69,auVar81);
              auVar81 = vfmadd231ps_fma(auVar38,auVar61,auVar39);
              auVar39 = vaddps_avx512vl(auVar31,auVar35);
              auVar39 = vfmadd231ps_avx512vl(auVar39,auVar42,auVar61);
              auVar40 = vfmadd231ps_avx512vl(auVar39,auVar41,auVar64);
              auVar32 = vmulps_avx512vl(auVar32,auVar69);
              auVar31 = vfmadd231ps_avx512vl(auVar32,auVar61,auVar31);
              auVar31 = vfnmadd231ps_avx512vl(auVar31,auVar69,auVar42);
              auVar32 = vfmadd231ps_avx512vl(auVar31,auVar61,auVar41);
              auVar31 = vshufps_avx(auVar90,auVar90,0xc9);
              auVar39 = vshufps_avx512vl(auVar36,auVar36,0xc9);
              fVar89 = auVar90._0_4_;
              auVar102._0_4_ = fVar89 * auVar39._0_4_;
              fVar94 = auVar90._4_4_;
              auVar102._4_4_ = fVar94 * auVar39._4_4_;
              fVar95 = auVar90._8_4_;
              auVar102._8_4_ = fVar95 * auVar39._8_4_;
              fVar96 = auVar90._12_4_;
              auVar102._12_4_ = fVar96 * auVar39._12_4_;
              auVar39 = vfmsub231ps_avx512vl(auVar102,auVar31,auVar36);
              auVar39 = vshufps_avx(auVar39,auVar39,0xc9);
              auVar38 = vshufps_avx512vl(auVar37,auVar37,0xc9);
              auVar103._0_4_ = fVar89 * auVar38._0_4_;
              auVar103._4_4_ = fVar94 * auVar38._4_4_;
              auVar103._8_4_ = fVar95 * auVar38._8_4_;
              auVar103._12_4_ = fVar96 * auVar38._12_4_;
              auVar31 = vfmsub231ps_avx512vl(auVar103,auVar31,auVar37);
              auVar43._0_16_ = vxorps_avx512vl(auVar37,auVar37);
              auVar108 = ZEXT1664(auVar43._0_16_);
              auVar38 = vshufps_avx(auVar31,auVar31,0xc9);
              auVar31 = vshufps_avx(auVar81,auVar81,0xc9);
              auVar41 = vshufps_avx512vl(auVar40,auVar40,0xc9);
              auVar97._0_4_ = auVar81._0_4_ * auVar41._0_4_;
              auVar97._4_4_ = auVar81._4_4_ * auVar41._4_4_;
              auVar97._8_4_ = auVar81._8_4_ * auVar41._8_4_;
              auVar97._12_4_ = auVar81._12_4_ * auVar41._12_4_;
              auVar40 = vfmsub231ps_avx512vl(auVar97,auVar31,auVar40);
              auVar40 = vshufps_avx(auVar40,auVar40,0xc9);
              auVar41 = vshufps_avx512vl(auVar32,auVar32,0xc9);
              auVar41 = vmulps_avx512vl(auVar81,auVar41);
              auVar31 = vfmsub231ps_avx512vl(auVar41,auVar31,auVar32);
              auVar41 = vshufps_avx512vl(auVar31,auVar31,0xc9);
              auVar31 = vdpps_avx(auVar39,auVar39,0x7f);
              auVar47._4_28_ = auVar43._4_28_;
              auVar47._0_4_ = auVar31._0_4_;
              auVar32 = vrsqrt14ss_avx512f(auVar43._0_16_,auVar47._0_16_);
              auVar42 = vmulss_avx512f(auVar32,SUB6416(ZEXT464(0x3fc00000),0));
              auVar35 = vmulss_avx512f(auVar31,ZEXT416(0xbf000000));
              auVar35 = vmulss_avx512f(auVar35,auVar32);
              auVar32 = vmulss_avx512f(auVar32,auVar32);
              auVar32 = vmulss_avx512f(auVar35,auVar32);
              auVar42 = vaddss_avx512f(auVar42,auVar32);
              auVar32 = vdpps_avx(auVar39,auVar38,0x7f);
              auVar42 = vbroadcastss_avx512vl(auVar42);
              auVar35 = vmulps_avx512vl(auVar39,auVar42);
              auVar36 = vbroadcastss_avx512vl(auVar31);
              auVar38 = vmulps_avx512vl(auVar36,auVar38);
              fVar73 = auVar32._0_4_;
              auVar37._0_4_ = auVar39._0_4_ * fVar73;
              auVar37._4_4_ = auVar39._4_4_ * fVar73;
              auVar37._8_4_ = auVar39._8_4_ * fVar73;
              auVar37._12_4_ = auVar39._12_4_ * fVar73;
              auVar32 = vsubps_avx(auVar38,auVar37);
              auVar39 = vrcp14ss_avx512f(auVar43._0_16_,auVar47._0_16_);
              auVar31 = vfnmadd213ss_avx512f(auVar31,auVar39,ZEXT416(0x40000000));
              fVar73 = auVar39._0_4_ * auVar31._0_4_;
              auVar36._0_4_ = fVar73 * auVar32._0_4_;
              auVar36._4_4_ = fVar73 * auVar32._4_4_;
              auVar36._8_4_ = fVar73 * auVar32._8_4_;
              auVar36._12_4_ = fVar73 * auVar32._12_4_;
              auVar42 = vmulps_avx512vl(auVar42,auVar36);
              auVar31 = vdpps_avx(auVar40,auVar40,0x7f);
              auVar48._16_16_ = auVar43._16_16_;
              auVar48._0_16_ = auVar43._0_16_;
              auVar45._4_28_ = auVar48._4_28_;
              auVar45._0_4_ = auVar31._0_4_;
              auVar32 = vrsqrt14ss_avx512f(auVar43._0_16_,auVar45._0_16_);
              auVar39 = vmulss_avx512f(auVar32,SUB6416(ZEXT464(0x3fc00000),0));
              auVar38 = vmulss_avx512f(auVar31,ZEXT416(0xbf000000));
              auVar38 = vmulss_avx512f(auVar38,auVar32);
              auVar32 = vmulss_avx512f(auVar38,ZEXT416((uint)(auVar32._0_4_ * auVar32._0_4_)));
              auVar32 = vaddss_avx512f(auVar39,auVar32);
              auVar104._0_4_ = auVar32._0_4_;
              auVar104._4_4_ = auVar104._0_4_;
              auVar104._8_4_ = auVar104._0_4_;
              auVar104._12_4_ = auVar104._0_4_;
              auVar32 = vdpps_avx(auVar40,auVar41,0x7f);
              auVar36 = vmulps_avx512vl(auVar40,auVar104);
              auVar39 = vbroadcastss_avx512vl(auVar31);
              auVar39 = vmulps_avx512vl(auVar39,auVar41);
              fVar73 = auVar32._0_4_;
              auVar74._0_4_ = auVar40._0_4_ * fVar73;
              auVar74._4_4_ = auVar40._4_4_ * fVar73;
              auVar74._8_4_ = auVar40._8_4_ * fVar73;
              auVar74._12_4_ = auVar40._12_4_ * fVar73;
              auVar39 = vsubps_avx(auVar39,auVar74);
              auVar32 = vrcp14ss_avx512f(auVar43._0_16_,auVar45._0_16_);
              auVar31 = vfnmadd213ss_avx512f(auVar31,auVar32,ZEXT416(0x40000000));
              fVar73 = auVar32._0_4_ * auVar31._0_4_;
              auVar31 = vshufps_avx(auVar33,auVar33,0xff);
              auVar41 = vmulps_avx512vl(auVar31,auVar35);
              auVar38 = vsubps_avx(auVar33,auVar41);
              auVar32 = vshufps_avx(auVar90,auVar90,0xff);
              auVar32 = vmulps_avx512vl(auVar32,auVar35);
              auVar35._0_4_ = auVar32._0_4_ + auVar31._0_4_ * auVar42._0_4_;
              auVar35._4_4_ = auVar32._4_4_ + auVar31._4_4_ * auVar42._4_4_;
              auVar35._8_4_ = auVar32._8_4_ + auVar31._8_4_ * auVar42._8_4_;
              auVar35._12_4_ = auVar32._12_4_ + auVar31._12_4_ * auVar42._12_4_;
              auVar40 = vsubps_avx(auVar90,auVar35);
              fVar82 = auVar33._0_4_ + auVar41._0_4_;
              fVar86 = auVar33._4_4_ + auVar41._4_4_;
              fVar87 = auVar33._8_4_ + auVar41._8_4_;
              fVar88 = auVar33._12_4_ + auVar41._12_4_;
              auVar98._0_4_ = fVar89 + auVar35._0_4_;
              auVar98._4_4_ = fVar94 + auVar35._4_4_;
              auVar98._8_4_ = fVar95 + auVar35._8_4_;
              auVar98._12_4_ = fVar96 + auVar35._12_4_;
              auVar31 = vshufps_avx(auVar34,auVar34,0xff);
              auVar41 = vmulps_avx512vl(auVar31,auVar36);
              auVar33 = vsubps_avx(auVar34,auVar41);
              auVar32 = vshufps_avx(auVar81,auVar81,0xff);
              auVar32 = vmulps_avx512vl(auVar32,auVar36);
              auVar42._0_4_ =
                   auVar32._0_4_ + auVar31._0_4_ * auVar104._0_4_ * auVar39._0_4_ * fVar73;
              auVar42._4_4_ =
                   auVar32._4_4_ + auVar31._4_4_ * auVar104._0_4_ * auVar39._4_4_ * fVar73;
              auVar42._8_4_ =
                   auVar32._8_4_ + auVar31._8_4_ * auVar104._0_4_ * auVar39._8_4_ * fVar73;
              auVar42._12_4_ =
                   auVar32._12_4_ + auVar31._12_4_ * auVar104._0_4_ * auVar39._12_4_ * fVar73;
              auVar31 = vsubps_avx(auVar81,auVar42);
              auVar90._0_4_ = auVar34._0_4_ + auVar41._0_4_;
              auVar90._4_4_ = auVar34._4_4_ + auVar41._4_4_;
              auVar90._8_4_ = auVar34._8_4_ + auVar41._8_4_;
              auVar90._12_4_ = auVar34._12_4_ + auVar41._12_4_;
              auVar34._0_4_ = auVar81._0_4_ + auVar42._0_4_;
              auVar34._4_4_ = auVar81._4_4_ + auVar42._4_4_;
              auVar34._8_4_ = auVar81._8_4_ + auVar42._8_4_;
              auVar34._12_4_ = auVar81._12_4_ + auVar42._12_4_;
              auVar32 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
              auVar39 = vmulps_avx512vl(auVar40,auVar32);
              fVar73 = auVar38._0_4_;
              auVar41._0_4_ = fVar73 + auVar39._0_4_;
              auVar41._4_4_ = auVar38._4_4_ + auVar39._4_4_;
              auVar41._8_4_ = auVar38._8_4_ + auVar39._8_4_;
              auVar41._12_4_ = auVar38._12_4_ + auVar39._12_4_;
              auVar31 = vmulps_avx512vl(auVar31,auVar32);
              auVar31 = vsubps_avx(auVar33,auVar31);
              auVar72._4_4_ = fVar73;
              auVar72._0_4_ = fVar73;
              auVar72._8_4_ = fVar73;
              auVar72._12_4_ = fVar73;
              auVar72._16_4_ = fVar73;
              auVar72._20_4_ = fVar73;
              auVar72._24_4_ = fVar73;
              auVar72._28_4_ = fVar73;
              auVar43 = vbroadcastss_avx512vl(ZEXT416(1));
              auVar44 = vpermps_avx512vl(auVar43,ZEXT1632(auVar38));
              auVar45 = vbroadcastss_avx512vl(ZEXT416(2));
              auVar46 = vpermps_avx512vl(auVar45,ZEXT1632(auVar38));
              auVar47 = vbroadcastss_avx512vl(auVar41);
              auVar48 = vpermps_avx512vl(auVar43,ZEXT1632(auVar41));
              auVar49 = vpermps_avx512vl(auVar45,ZEXT1632(auVar41));
              auVar50 = vbroadcastss_avx512vl(auVar31);
              auVar51 = vpermps_avx512vl(auVar43,ZEXT1632(auVar31));
              auVar52 = vpermps_avx512vl(auVar45,ZEXT1632(auVar31));
              auVar53 = vbroadcastss_avx512vl(auVar33);
              auVar54 = vpermps_avx512vl(auVar43,ZEXT1632(auVar33));
              auVar55 = vpermps_avx512vl(auVar45,ZEXT1632(auVar33));
              auVar56 = vmulps_avx512vl(auVar53,bezier_basis0._3944_32_);
              auVar56 = vfmadd231ps_avx512vl(auVar56,bezier_basis0._2788_32_,auVar50);
              auVar53 = vmulps_avx512vl(auVar53,bezier_basis0._8568_32_);
              auVar53 = vfmadd231ps_avx512vl(auVar53,bezier_basis0._7412_32_,auVar50);
              auVar50 = vmulps_avx512vl(auVar54,bezier_basis0._3944_32_);
              auVar50 = vfmadd231ps_avx512vl(auVar50,bezier_basis0._2788_32_,auVar51);
              auVar54 = vmulps_avx512vl(auVar54,bezier_basis0._8568_32_);
              auVar51 = vfmadd231ps_avx512vl(auVar54,bezier_basis0._7412_32_,auVar51);
              auVar54 = vmulps_avx512vl(auVar55,bezier_basis0._3944_32_);
              auVar54 = vfmadd231ps_avx512vl(auVar54,bezier_basis0._2788_32_,auVar52);
              auVar56 = vfmadd231ps_avx512vl(auVar56,bezier_basis0._1632_32_,auVar47);
              auVar50 = vfmadd231ps_avx512vl(auVar50,bezier_basis0._1632_32_,auVar48);
              auVar54 = vfmadd231ps_avx512vl(auVar54,bezier_basis0._1632_32_,auVar49);
              auVar56 = vfmadd231ps_avx512vl(auVar56,bezier_basis0._476_32_,auVar72);
              auVar57 = vfmadd231ps_avx512vl(auVar50,bezier_basis0._476_32_,auVar44);
              auVar54 = vfmadd231ps_avx512vl(auVar54,bezier_basis0._476_32_,auVar46);
              auVar50._4_4_ = auVar55._4_4_ * bezier_basis0._8572_4_;
              auVar50._0_4_ = auVar55._0_4_ * bezier_basis0._8568_4_;
              auVar50._8_4_ = auVar55._8_4_ * bezier_basis0._8576_4_;
              auVar50._12_4_ = auVar55._12_4_ * bezier_basis0._8580_4_;
              auVar50._16_4_ = auVar55._16_4_ * bezier_basis0._8584_4_;
              auVar50._20_4_ = auVar55._20_4_ * bezier_basis0._8588_4_;
              auVar50._24_4_ = auVar55._24_4_ * bezier_basis0._8592_4_;
              auVar50._28_4_ = auVar55._28_4_;
              auVar31 = vfmadd231ps_fma(auVar50,bezier_basis0._7412_32_,auVar52);
              auVar50 = vfmadd231ps_avx512vl(auVar53,bezier_basis0._6256_32_,auVar47);
              auVar47 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._6256_32_,auVar48);
              auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),bezier_basis0._6256_32_,auVar49);
              auVar50 = vfmadd231ps_avx512vl(auVar50,bezier_basis0._5100_32_,auVar72);
              auVar44 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._5100_32_,auVar44);
              auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),bezier_basis0._5100_32_,auVar46);
              auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
              auVar49 = vmulps_avx512vl(auVar50,auVar48);
              auVar51 = vmulps_avx512vl(auVar44,auVar48);
              auVar52 = vmulps_avx512vl(ZEXT1632(auVar31),auVar48);
              auVar33 = ZEXT816(0) << 0x40;
              auVar44 = vblendps_avx(auVar49,ZEXT1632(auVar33),1);
              auVar50 = vblendps_avx(auVar51,ZEXT1632(auVar33),1);
              auVar58 = ZEXT1632(auVar33);
              auVar46 = vblendps_avx(auVar52,auVar58,1);
              auVar47 = vsubps_avx(auVar56,auVar44);
              auVar53 = vsubps_avx512vl(auVar57,auVar50);
              auVar55 = vsubps_avx512vl(auVar54,auVar46);
              auVar44 = vblendps_avx(auVar49,auVar58,0x80);
              auVar50 = vblendps_avx(auVar51,auVar58,0x80);
              auVar46 = vblendps_avx(auVar52,auVar58,0x80);
              auVar59._0_4_ = auVar56._0_4_ + auVar44._0_4_;
              auVar59._4_4_ = auVar56._4_4_ + auVar44._4_4_;
              auVar59._8_4_ = auVar56._8_4_ + auVar44._8_4_;
              auVar59._12_4_ = auVar56._12_4_ + auVar44._12_4_;
              auVar59._16_4_ = auVar56._16_4_ + auVar44._16_4_;
              auVar59._20_4_ = auVar56._20_4_ + auVar44._20_4_;
              auVar59._24_4_ = auVar56._24_4_ + auVar44._24_4_;
              auVar59._28_4_ = auVar56._28_4_ + auVar44._28_4_;
              auVar50 = vaddps_avx512vl(auVar57,auVar50);
              auVar46 = vaddps_avx512vl(auVar54,auVar46);
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar44 = vminps_avx512vl(auVar49,auVar56);
              auVar51 = vminps_avx512vl(auVar49,auVar57);
              auVar52 = vminps_avx512vl(auVar49,auVar54);
              auVar58 = vminps_avx512vl(auVar47,auVar59);
              auVar58 = vminps_avx512vl(auVar44,auVar58);
              auVar44 = vminps_avx512vl(auVar53,auVar50);
              auVar51 = vminps_avx512vl(auVar51,auVar44);
              auVar44 = vminps_avx512vl(auVar55,auVar46);
              auVar52 = vminps_avx512vl(auVar52,auVar44);
              auVar44 = vmaxps_avx(auVar47,auVar59);
              auVar38 = vmulps_avx512vl(auVar98,auVar32);
              fVar73 = fVar82 + auVar38._0_4_;
              auVar31 = vmulps_avx512vl(auVar34,auVar32);
              auVar40 = vsubps_avx512vl(auVar90,auVar31);
              in_ZMM21 = ZEXT1664(auVar40);
              auVar59 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar47 = vmaxps_avx512vl(auVar59,auVar56);
              auVar56 = vmaxps_avx512vl(auVar59,auVar57);
              auVar54 = vmaxps_avx512vl(auVar59,auVar54);
              auVar44 = vmaxps_avx(auVar47,auVar44);
              auVar50 = vmaxps_avx(auVar53,auVar50);
              auVar50 = vmaxps_avx(auVar56,auVar50);
              auVar46 = vmaxps_avx(auVar55,auVar46);
              auVar46 = vmaxps_avx(auVar54,auVar46);
              auVar47 = vshufps_avx512vl(auVar58,auVar58,0xb1);
              auVar53 = vminps_avx512vl(auVar58,auVar47);
              auVar47 = vshufpd_avx(auVar53,auVar53,5);
              auVar47 = vminps_avx(auVar53,auVar47);
              auVar31 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
              auVar47 = vshufps_avx512vl(auVar51,auVar51,0xb1);
              auVar51 = vminps_avx512vl(auVar51,auVar47);
              auVar47 = vshufpd_avx(auVar51,auVar51,5);
              auVar47 = vminps_avx(auVar51,auVar47);
              auVar32 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
              auVar32 = vunpcklps_avx(auVar31,auVar32);
              auVar47 = vshufps_avx512vl(auVar52,auVar52,0xb1);
              auVar51 = vminps_avx512vl(auVar52,auVar47);
              auVar47 = vshufpd_avx(auVar51,auVar51,5);
              auVar47 = vminps_avx(auVar51,auVar47);
              auVar31 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
              auVar31 = vinsertps_avx(auVar32,auVar31,0x28);
              auVar47 = vshufps_avx(auVar44,auVar44,0xb1);
              auVar44 = vmaxps_avx(auVar44,auVar47);
              auVar47 = vshufpd_avx(auVar44,auVar44,5);
              auVar44 = vmaxps_avx(auVar44,auVar47);
              auVar32 = vmaxps_avx(auVar44._0_16_,auVar44._16_16_);
              auVar44 = vshufps_avx(auVar50,auVar50,0xb1);
              auVar44 = vmaxps_avx(auVar50,auVar44);
              auVar50 = vshufpd_avx(auVar44,auVar44,5);
              auVar44 = vmaxps_avx(auVar44,auVar50);
              auVar39 = vmaxps_avx(auVar44._0_16_,auVar44._16_16_);
              auVar39 = vunpcklps_avx(auVar32,auVar39);
              auVar44 = vshufps_avx(auVar46,auVar46,0xb1);
              auVar44 = vmaxps_avx(auVar46,auVar44);
              auVar50 = vshufpd_avx(auVar44,auVar44,5);
              auVar44 = vmaxps_avx(auVar44,auVar50);
              auVar32 = vmaxps_avx(auVar44._0_16_,auVar44._16_16_);
              auVar32 = vinsertps_avx(auVar39,auVar32,0x28);
              auVar57._4_4_ = fVar82;
              auVar57._0_4_ = fVar82;
              auVar57._8_4_ = fVar82;
              auVar57._12_4_ = fVar82;
              auVar57._16_4_ = fVar82;
              auVar57._20_4_ = fVar82;
              auVar57._24_4_ = fVar82;
              auVar57._28_4_ = fVar82;
              auVar50 = ZEXT1632(CONCAT412(fVar88,CONCAT48(fVar87,CONCAT44(fVar86,fVar82))));
              auVar44 = vpermps_avx512vl(auVar43,auVar50);
              auVar50 = vpermps_avx512vl(auVar45,auVar50);
              auVar101._4_4_ = fVar73;
              auVar101._0_4_ = fVar73;
              auVar101._8_4_ = fVar73;
              auVar101._12_4_ = fVar73;
              auVar101._16_4_ = fVar73;
              auVar101._20_4_ = fVar73;
              auVar101._24_4_ = fVar73;
              auVar101._28_4_ = fVar73;
              auVar46 = ZEXT1632(CONCAT412(fVar88 + auVar38._12_4_,
                                           CONCAT48(fVar87 + auVar38._8_4_,
                                                    CONCAT44(fVar86 + auVar38._4_4_,fVar73))));
              auVar47 = vpermps_avx512vl(auVar43,auVar46);
              auVar51 = vpermps_avx512vl(auVar45,auVar46);
              auVar46 = vbroadcastss_avx512vl(auVar40);
              auVar52 = vpermps_avx512vl(auVar43,ZEXT1632(auVar40));
              auVar53 = vpermps_avx512vl(auVar45,ZEXT1632(auVar40));
              auVar54 = vbroadcastss_avx512vl(auVar90);
              auVar43 = vpermps_avx512vl(auVar43,ZEXT1632(auVar90));
              auVar45 = vpermps_avx512vl(auVar45,ZEXT1632(auVar90));
              auVar55 = vmulps_avx512vl(auVar54,bezier_basis0._3944_32_);
              auVar55 = vfmadd231ps_avx512vl(auVar55,bezier_basis0._2788_32_,auVar46);
              auVar54 = vmulps_avx512vl(auVar54,bezier_basis0._8568_32_);
              auVar54 = vfmadd231ps_avx512vl(auVar54,bezier_basis0._7412_32_,auVar46);
              auVar46 = vmulps_avx512vl(auVar43,bezier_basis0._3944_32_);
              auVar46 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._2788_32_,auVar52);
              auVar43 = vmulps_avx512vl(auVar43,bezier_basis0._8568_32_);
              auVar43 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._7412_32_,auVar52);
              auVar52 = vmulps_avx512vl(auVar45,bezier_basis0._3944_32_);
              auVar52 = vfmadd231ps_avx512vl(auVar52,bezier_basis0._2788_32_,auVar53);
              auVar55 = vfmadd231ps_avx512vl(auVar55,bezier_basis0._1632_32_,auVar101);
              auVar46 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._1632_32_,auVar47);
              auVar52 = vfmadd231ps_avx512vl(auVar52,bezier_basis0._1632_32_,auVar51);
              auVar55 = vfmadd231ps_avx512vl(auVar55,bezier_basis0._476_32_,auVar57);
              auVar56 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._476_32_,auVar44);
              auVar52 = vfmadd231ps_avx512vl(auVar52,bezier_basis0._476_32_,auVar50);
              auVar46._4_4_ = auVar45._4_4_ * bezier_basis0._8572_4_;
              auVar46._0_4_ = auVar45._0_4_ * bezier_basis0._8568_4_;
              auVar46._8_4_ = auVar45._8_4_ * bezier_basis0._8576_4_;
              auVar46._12_4_ = auVar45._12_4_ * bezier_basis0._8580_4_;
              auVar46._16_4_ = auVar45._16_4_ * bezier_basis0._8584_4_;
              auVar46._20_4_ = auVar45._20_4_ * bezier_basis0._8588_4_;
              auVar46._24_4_ = auVar45._24_4_ * bezier_basis0._8592_4_;
              auVar46._28_4_ = auVar45._28_4_;
              auVar46 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._7412_32_,auVar53);
              auVar45 = vfmadd231ps_avx512vl(auVar54,bezier_basis0._6256_32_,auVar101);
              auVar47 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._6256_32_,auVar47);
              auVar39 = vfmadd231ps_fma(auVar46,bezier_basis0._6256_32_,auVar51);
              auVar46 = vfmadd231ps_avx512vl(auVar45,bezier_basis0._5100_32_,auVar57);
              auVar44 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._5100_32_,auVar44);
              auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),bezier_basis0._5100_32_,auVar50);
              auVar45 = vmulps_avx512vl(auVar46,auVar48);
              auVar51 = vmulps_avx512vl(auVar44,auVar48);
              auVar48 = vmulps_avx512vl(ZEXT1632(auVar39),auVar48);
              auVar54 = ZEXT1632(auVar33);
              auVar44 = vblendps_avx(auVar45,auVar54,1);
              auVar50 = vblendps_avx(auVar51,auVar54,1);
              auVar46 = vblendps_avx(auVar48,auVar54,1);
              auVar47 = vsubps_avx(auVar55,auVar44);
              auVar43 = vsubps_avx(auVar56,auVar50);
              auVar53 = vsubps_avx512vl(auVar52,auVar46);
              auVar44 = vblendps_avx(auVar45,auVar54,0x80);
              auVar50 = vblendps_avx(auVar51,auVar54,0x80);
              auVar46 = vblendps_avx(auVar48,auVar54,0x80);
              auVar54._0_4_ = auVar55._0_4_ + auVar44._0_4_;
              auVar54._4_4_ = auVar55._4_4_ + auVar44._4_4_;
              auVar54._8_4_ = auVar55._8_4_ + auVar44._8_4_;
              auVar54._12_4_ = auVar55._12_4_ + auVar44._12_4_;
              auVar54._16_4_ = auVar55._16_4_ + auVar44._16_4_;
              auVar54._20_4_ = auVar55._20_4_ + auVar44._20_4_;
              auVar54._24_4_ = auVar55._24_4_ + auVar44._24_4_;
              auVar54._28_4_ = auVar55._28_4_ + auVar44._28_4_;
              auVar58._0_4_ = auVar56._0_4_ + auVar50._0_4_;
              auVar58._4_4_ = auVar56._4_4_ + auVar50._4_4_;
              auVar58._8_4_ = auVar56._8_4_ + auVar50._8_4_;
              auVar58._12_4_ = auVar56._12_4_ + auVar50._12_4_;
              auVar58._16_4_ = auVar56._16_4_ + auVar50._16_4_;
              auVar58._20_4_ = auVar56._20_4_ + auVar50._20_4_;
              auVar58._24_4_ = auVar56._24_4_ + auVar50._24_4_;
              auVar58._28_4_ = auVar56._28_4_ + auVar50._28_4_;
              auVar45 = vaddps_avx512vl(auVar52,auVar46);
              auVar44 = vminps_avx512vl(auVar49,auVar55);
              auVar50 = vminps_avx512vl(auVar49,auVar56);
              auVar46 = vminps_avx512vl(auVar49,auVar52);
              auVar48 = vminps_avx512vl(auVar47,auVar54);
              auVar48 = vminps_avx512vl(auVar44,auVar48);
              auVar44 = vminps_avx512vl(auVar43,auVar58);
              auVar49 = vminps_avx512vl(auVar50,auVar44);
              auVar44 = vminps_avx512vl(auVar53,auVar45);
              auVar51 = vminps_avx512vl(auVar46,auVar44);
              auVar44 = vmaxps_avx(auVar47,auVar54);
              auVar50 = vmaxps_avx512vl(auVar59,auVar55);
              auVar50 = vmaxps_avx(auVar50,auVar44);
              auVar44 = vmaxps_avx(auVar43,auVar58);
              auVar46 = vmaxps_avx512vl(auVar59,auVar56);
              auVar105 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
              auVar46 = vmaxps_avx(auVar46,auVar44);
              auVar44 = vmaxps_avx(auVar53,auVar45);
              auVar47 = vmaxps_avx512vl(auVar59,auVar52);
              auVar47 = vmaxps_avx(auVar47,auVar44);
              auVar44 = vshufps_avx(auVar48,auVar48,0xb1);
              auVar44 = vminps_avx(auVar48,auVar44);
              auVar43 = vshufpd_avx(auVar44,auVar44,5);
              auVar44 = vminps_avx(auVar44,auVar43);
              auVar39 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
              auVar44 = vshufps_avx512vl(auVar49,auVar49,0xb1);
              auVar43 = vminps_avx512vl(auVar49,auVar44);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
              auVar106 = ZEXT1664(auVar40);
              auVar44 = vshufpd_avx(auVar43,auVar43,5);
              auVar44 = vminps_avx(auVar43,auVar44);
              auVar38 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
              auVar38 = vunpcklps_avx(auVar39,auVar38);
              auVar44 = vshufps_avx512vl(auVar51,auVar51,0xb1);
              auVar45 = vminps_avx512vl(auVar51,auVar44);
              auVar44._16_16_ = auVar45._16_16_;
              auVar44._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
              auVar107 = ZEXT1664(auVar44._0_16_);
              auVar43 = vshufpd_avx(auVar45,auVar45,5);
              auVar43 = vminps_avx(auVar45,auVar43);
              auVar39 = vminps_avx(auVar43._0_16_,auVar43._16_16_);
              auVar39 = vinsertps_avx(auVar38,auVar39,0x28);
              auVar38 = vminps_avx(auVar31,auVar39);
              auVar43 = vshufps_avx(auVar50,auVar50,0xb1);
              auVar50 = vmaxps_avx(auVar50,auVar43);
              auVar43 = vshufpd_avx(auVar50,auVar50,5);
              auVar50 = vmaxps_avx(auVar50,auVar43);
              auVar31 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
              auVar50 = vshufps_avx(auVar46,auVar46,0xb1);
              auVar50 = vmaxps_avx(auVar46,auVar50);
              auVar46 = vshufpd_avx(auVar50,auVar50,5);
              auVar50 = vmaxps_avx(auVar50,auVar46);
              auVar39 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
              auVar39 = vunpcklps_avx(auVar31,auVar39);
              auVar50 = vshufps_avx(auVar47,auVar47,0xb1);
              auVar50 = vmaxps_avx(auVar47,auVar50);
              auVar46 = vshufpd_avx(auVar50,auVar50,5);
              auVar50 = vmaxps_avx(auVar50,auVar46);
              auVar31 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
              auVar31 = vinsertps_avx(auVar39,auVar31,0x28);
              auVar31 = vmaxps_avx(auVar32,auVar31);
              uVar11 = vcmpps_avx512vl(auVar31,auVar44._0_16_,1);
              uVar12 = vcmpps_avx512vl(auVar38,auVar40,6);
              if ((~((ushort)uVar11 & (ushort)uVar12) & 7) != 0) goto LAB_01faa16f;
              uVar19 = uVar19 + 1;
              lVar26 = lVar26 + 0x38;
              bVar29 = uVar19 == uVar21;
              bVar7 = uVar21 < uVar19;
            } while (uVar19 <= uVar21);
          }
          local_f8.primID = &local_100;
          fVar60 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.super_Geometry.time_range.lower;
          fVar82 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.super_Geometry.time_range.upper - fVar60;
          fVar87 = (auVar30._0_4_ - fVar60) / fVar82;
          fVar82 = (fVar75 - fVar60) / fVar82;
          fVar60 = fVar10 * fVar87;
          fVar73 = fVar10 * fVar82;
          auVar39 = vroundss_avx(ZEXT416((uint)fVar60),ZEXT416((uint)fVar60),9);
          auVar38 = vroundss_avx(ZEXT416((uint)fVar73),ZEXT416((uint)fVar73),10);
          auVar31 = vmaxss_avx(auVar39,ZEXT416(0));
          auVar32 = vminss_avx(auVar38,ZEXT416((uint)fVar10));
          iVar16 = (int)auVar31._0_4_;
          fVar86 = auVar32._0_4_;
          uVar2 = (int)auVar39._0_4_;
          if ((int)auVar39._0_4_ < 0) {
            uVar2 = 0xffffffff;
          }
          iVar15 = (int)fVar10 + 1;
          if ((int)auVar38._0_4_ < (int)fVar10 + 1) {
            iVar15 = (int)auVar38._0_4_;
          }
          local_100 = uVar27;
          local_f8.this = this;
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_c8.field_1,&local_f8,(long)iVar16);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_e8.field_1,&local_f8,(long)(int)fVar86);
          fVar60 = fVar60 - auVar31._0_4_;
          if (iVar15 - uVar2 == 1) {
            auVar31 = vmaxss_avx(ZEXT416((uint)fVar60),ZEXT816(0) << 0x40);
            fVar60 = auVar31._0_4_;
            fVar10 = 1.0 - fVar60;
            auVar77._0_4_ = fVar60 * local_e8.m128[0];
            auVar77._4_4_ = fVar60 * local_e8.m128[1];
            auVar77._8_4_ = fVar60 * local_e8.m128[2];
            auVar77._12_4_ = fVar60 * local_e8.m128[3];
            auVar65._4_4_ = fVar10;
            auVar65._0_4_ = fVar10;
            auVar65._8_4_ = fVar10;
            auVar65._12_4_ = fVar10;
            auVar33 = vfmadd231ps_fma(auVar77,auVar65,(undefined1  [16])local_c8);
            auVar79._0_4_ = fVar60 * local_d8._0_4_;
            auVar79._4_4_ = fVar60 * local_d8._4_4_;
            auVar79._8_4_ = fVar60 * local_d8._8_4_;
            auVar79._12_4_ = fVar60 * local_d8._12_4_;
            auVar81 = vfmadd231ps_fma(auVar79,local_b8,auVar65);
            auVar31 = vmaxss_avx(ZEXT416((uint)(fVar86 - fVar73)),ZEXT816(0) << 0x40);
            fVar60 = auVar31._0_4_;
            fVar10 = 1.0 - fVar60;
            auVar83._0_4_ = fVar60 * local_c8.m128[0];
            auVar83._4_4_ = fVar60 * local_c8.m128[1];
            auVar83._8_4_ = fVar60 * local_c8.m128[2];
            auVar83._12_4_ = fVar60 * local_c8.m128[3];
            auVar66._4_4_ = fVar10;
            auVar66._0_4_ = fVar10;
            auVar66._8_4_ = fVar10;
            auVar66._12_4_ = fVar10;
            auVar85 = vfmadd231ps_fma(auVar83,auVar66,(undefined1  [16])local_e8);
            auVar91._0_4_ = fVar60 * local_b8._0_4_;
            auVar91._4_4_ = fVar60 * local_b8._4_4_;
            auVar91._8_4_ = fVar60 * local_b8._8_4_;
            auVar91._12_4_ = fVar60 * local_b8._12_4_;
            auVar93 = vfmadd231ps_fma(auVar91,auVar66,local_d8);
            auVar31 = ZEXT816(0);
            auVar32 = vxorps_avx512vl(auVar108._0_16_,auVar108._0_16_);
            auVar108 = ZEXT1664(auVar32);
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_f8,(long)(iVar16 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_f8,(long)((int)fVar86 + -1));
            auVar31 = vmaxss_avx(ZEXT416((uint)fVar60),ZEXT816(0) << 0x40);
            fVar88 = auVar31._0_4_;
            auVar78._0_4_ = fVar88 * local_58.m128[0];
            auVar78._4_4_ = fVar88 * local_58.m128[1];
            auVar78._8_4_ = fVar88 * local_58.m128[2];
            auVar78._12_4_ = fVar88 * local_58.m128[3];
            fVar60 = 1.0 - fVar88;
            auVar62._4_4_ = fVar60;
            auVar62._0_4_ = fVar60;
            auVar62._8_4_ = fVar60;
            auVar62._12_4_ = fVar60;
            auVar33 = vfmadd231ps_fma(auVar78,auVar62,(undefined1  [16])local_c8);
            auVar80._0_4_ = fVar88 * local_48;
            auVar80._4_4_ = fVar88 * fStack_44;
            auVar80._8_4_ = fVar88 * fStack_40;
            auVar80._12_4_ = fVar88 * fStack_3c;
            auVar81 = vfmadd231ps_fma(auVar80,auVar62,local_b8);
            auVar31 = vmaxss_avx(ZEXT416((uint)(fVar86 - fVar73)),ZEXT816(0) << 0x40);
            fVar73 = auVar31._0_4_;
            fVar60 = 1.0 - fVar73;
            auVar84._0_4_ = fVar73 * local_78.m128[0];
            auVar84._4_4_ = fVar73 * local_78.m128[1];
            auVar84._8_4_ = fVar73 * local_78.m128[2];
            auVar84._12_4_ = fVar73 * local_78.m128[3];
            auVar67._4_4_ = fVar60;
            auVar67._0_4_ = fVar60;
            auVar67._8_4_ = fVar60;
            auVar67._12_4_ = fVar60;
            auVar85 = vfmadd231ps_fma(auVar84,auVar67,(undefined1  [16])local_e8);
            auVar92._0_4_ = fVar73 * local_68;
            auVar92._4_4_ = fVar73 * fStack_64;
            auVar92._8_4_ = fVar73 * fStack_60;
            auVar92._12_4_ = fVar73 * fStack_5c;
            auVar93 = vfmadd231ps_fma(auVar92,auVar67,local_d8);
            if ((int)(uVar2 + 1) < iVar15) {
              itime = (size_t)(uVar2 + 1);
              iVar15 = ~uVar2 + iVar15;
              do {
                auVar32 = auVar108._0_16_;
                fVar73 = ((float)(int)itime / fVar10 - fVar87) / (fVar82 - fVar87);
                fVar60 = 1.0 - fVar73;
                auVar70._0_4_ = auVar85._0_4_ * fVar73;
                fVar86 = auVar85._4_4_;
                auVar70._4_4_ = fVar86 * fVar73;
                fVar88 = auVar85._8_4_;
                auVar70._8_4_ = fVar88 * fVar73;
                fVar89 = auVar85._12_4_;
                auVar70._12_4_ = fVar89 * fVar73;
                auVar68._4_4_ = fVar60;
                auVar68._0_4_ = fVar60;
                auVar68._8_4_ = fVar60;
                auVar68._12_4_ = fVar60;
                auVar31 = vfmadd231ps_fma(auVar70,auVar68,auVar33);
                auVar63._0_4_ = auVar93._0_4_ * fVar73;
                fVar60 = auVar93._4_4_;
                auVar63._4_4_ = fVar60 * fVar73;
                fVar94 = auVar93._8_4_;
                auVar63._8_4_ = fVar94 * fVar73;
                fVar95 = auVar93._12_4_;
                auVar63._12_4_ = fVar95 * fVar73;
                local_a8 = vfmadd231ps_fma(auVar63,auVar81,auVar68);
                linearBounds::anon_class_16_2_07cfa4d6::operator()
                          ((BBox3fa *)&local_98.field_1,&local_f8,itime);
                local_1e8 = auVar81._0_4_;
                fStack_1e4 = auVar81._4_4_;
                fStack_1e0 = auVar81._8_4_;
                fStack_1dc = auVar81._12_4_;
                local_1d8 = auVar33._0_4_;
                fStack_1d4 = auVar33._4_4_;
                fStack_1d0 = auVar33._8_4_;
                fStack_1cc = auVar33._12_4_;
                auVar39 = vxorps_avx512vl(auVar32,auVar32);
                auVar108 = ZEXT1664(auVar39);
                auVar31 = vsubps_avx((undefined1  [16])local_98,auVar31);
                auVar32 = vsubps_avx(local_88,local_a8);
                auVar31 = vminps_avx512vl(auVar31,auVar39);
                auVar32 = vmaxps_avx512vl(auVar32,auVar39);
                auVar33._0_4_ = local_1d8 + auVar31._0_4_;
                auVar33._4_4_ = fStack_1d4 + auVar31._4_4_;
                auVar33._8_4_ = fStack_1d0 + auVar31._8_4_;
                auVar33._12_4_ = fStack_1cc + auVar31._12_4_;
                auVar85._0_4_ = auVar85._0_4_ + auVar31._0_4_;
                auVar85._4_4_ = fVar86 + auVar31._4_4_;
                auVar85._8_4_ = fVar88 + auVar31._8_4_;
                auVar85._12_4_ = fVar89 + auVar31._12_4_;
                auVar81._0_4_ = local_1e8 + auVar32._0_4_;
                auVar81._4_4_ = fStack_1e4 + auVar32._4_4_;
                auVar81._8_4_ = fStack_1e0 + auVar32._8_4_;
                auVar81._12_4_ = fStack_1dc + auVar32._12_4_;
                auVar93._0_4_ = auVar93._0_4_ + auVar32._0_4_;
                auVar93._4_4_ = fVar60 + auVar32._4_4_;
                auVar93._8_4_ = fVar94 + auVar32._8_4_;
                auVar93._12_4_ = fVar95 + auVar32._12_4_;
                itime = itime + 1;
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
            else {
              auVar31 = vxorps_avx512vl(auVar108._0_16_,auVar108._0_16_);
              auVar108 = ZEXT1664(auVar31);
            }
            auVar31 = ZEXT816(0) << 0x40;
          }
          auVar76 = ZEXT1664(auVar31);
          uVar11 = vcmpps_avx512vl(auVar33,auVar81,2);
          auVar105 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar31 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
          auVar106 = ZEXT1664(auVar31);
          auVar31 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
          auVar107 = ZEXT1664(auVar31);
          if (((~(ushort)uVar11 & 7) == 0) &&
             (uVar11 = vcmpps_avx512vl(auVar85,auVar93,2), (~(ushort)uVar11 & 7) == 0)) {
            auVar31 = vminps_avx(auVar33,auVar85);
            aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar31,ZEXT416(geomID),0x30);
            auVar31 = vmaxps_avx(auVar81,auVar93);
            aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar31,ZEXT416((uint)uVar27),0x30);
            auVar71._0_4_ = aVar8.x + aVar9.x;
            auVar71._4_4_ = aVar8.y + aVar9.y;
            auVar71._8_4_ = aVar8.z + aVar9.z;
            auVar71._12_4_ = aVar8.field_3.w + aVar9.field_3.w;
            local_168 = vminps_avx(local_168,(undefined1  [16])aVar8);
            local_178 = vmaxps_avx(local_178,(undefined1  [16])aVar9);
            local_188 = vminps_avx(local_188,auVar71);
            local_198 = vmaxps_avx(local_198,auVar71);
            local_1b0 = local_1b0 + 1;
            prims[local_1a8].lower.field_0.field_1 = aVar8;
            prims[local_1a8].upper.field_0.field_1 = aVar9;
            local_1a8 = local_1a8 + 1;
          }
        }
LAB_01faa670:
        uVar27 = uVar27 + 1;
      } while (uVar27 < r->_end);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_168._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_168._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_178._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_178._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_188._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_198._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_198._8_8_;
    __return_storage_ptr__->end = local_1b0;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }